

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

file_time_type ghc::filesystem::last_write_time(path *p,error_code *ec)

{
  error_category *peVar1;
  file_time_type fVar2;
  time_t result;
  file_status fs;
  long local_28 [2];
  
  local_28[0] = 0;
  peVar1 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar1;
  detail::status_ex((path *)(local_28 + 1),(error_code *)p,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,(int)local_28);
  fVar2.__d.__r = (duration)(duration)-0x8000000000000000;
  if (ec->_M_value == 0) {
    fVar2.__d.__r = (duration)(duration)(local_28[0] * 1000000000);
  }
  return (file_time_type)fVar2.__d.__r;
}

Assistant:

GHC_INLINE file_time_type last_write_time(const path& p, std::error_code& ec) noexcept
{
    time_t result = 0;
    ec.clear();
    file_status fs = detail::status_ex(p, ec, nullptr, nullptr, nullptr, &result);
    return ec ? (file_time_type::min)() : std::chrono::system_clock::from_time_t(result);
}